

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O2

void __thiscall Lib::DArray<Kernel::Term_*>::expand(DArray<Kernel::Term_*> *this,size_t s)

{
  Term **__ptr;
  Term **ppTVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  if (this->_capacity < s) {
    uVar4 = this->_capacity * 2;
    if (uVar4 <= s) {
      uVar4 = s;
    }
    ppTVar1 = (Term **)Lib::alloc(uVar4 * 8);
    __ptr = this->_array;
    this->_capacity = uVar4;
    this->_array = ppTVar1;
    lVar2 = this->_size << 3;
    for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 8) {
      *(undefined8 *)((long)ppTVar1 + lVar3) = *(undefined8 *)((long)__ptr + lVar3);
    }
    for (; uVar4 * 8 - lVar2 != 0; lVar2 = lVar2 + 8) {
      *(undefined8 *)((long)ppTVar1 + lVar2) = 0;
    }
    this->_size = s;
    if (__ptr != (Term **)0x0) {
      Lib::free(__ptr);
      return;
    }
  }
  else {
    this->_size = s;
  }
  return;
}

Assistant:

void expand(size_t s)
  {
    if (_capacity >= s) {
      _size = s;
      return;
    }

    size_t oldCapacity=_capacity;
    size_t newCapacity=std::max(s, oldCapacity*2);
    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"DArray<>");

    C* oldArr = _array;

    _capacity = newCapacity;
    _array = static_cast<C*>(mem);

    C* optr=oldArr;
    C* nptr=_array;
    C* firstEmpty=_array+_size;
    C* afterLast=_array+_capacity;

    while(nptr!=firstEmpty) {
      C *oldAddr = optr++, *newAddr = nptr++;
      ::new (newAddr) C(std::move(*oldAddr));
      oldAddr->~C();
    }
    while(nptr!=afterLast) {
      ::new (nptr++) C();
    }
    _size = s;

    if(oldArr) {
      DEALLOC_KNOWN(oldArr,sizeof(C)*oldCapacity,"DArray<>");
    }

  }